

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_set.h
# Opt level: O3

void __thiscall
embree::parallel_set<unsigned_int>::init<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (parallel_set<unsigned_int> *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *in)

{
  pointer puVar1;
  pointer puVar2;
  uint *src;
  char cVar3;
  runtime_error *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> temp;
  auto_partitioner local_d9;
  anon_class_8_1_898bcfc2 local_d8;
  blocked_range<unsigned_long> local_d0;
  anon_class_16_2_e88080a0 local_b8;
  task_group_context local_a8;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->vec,
             (long)(in->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(in->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  puVar1 = (in->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (in->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_a8.my_version = proxy_support;
  local_a8.my_traits = (context_traits)0x4;
  local_a8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_a8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_a8.my_name = CUSTOM_CTX;
  local_b8.this = this;
  local_b8.in = in;
  tbb::detail::r1::initialize(&local_a8);
  local_d0.my_begin = 0;
  local_d0.my_grainsize = 0x4000;
  local_d8.func = &local_b8;
  local_d0.my_end = (long)puVar1 - (long)puVar2 >> 2;
  tbb::detail::d1::
  start_for<tbb::detail::d1::blocked_range<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/build_O3/../common/algorithms/parallel_for.h:70:73),_const_tbb::detail::d1::auto_partitioner>
  ::run(&local_d0,&local_d8,&local_d9,&local_a8);
  cVar3 = tbb::detail::r1::is_group_execution_cancelled(&local_a8);
  if (cVar3 == '\0') {
    tbb::detail::r1::destroy(&local_a8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,
               (long)(in->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(in->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_d0);
    src = (this->vec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start;
    radix_sort<unsigned_int>
              (src,(uint *)local_a8.my_cpu_ctl_env,
               (long)(this->vec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)src >> 2,0x2000);
    if ((uint *)local_a8.my_cpu_ctl_env != (uint *)0x0) {
      operator_delete((void *)local_a8.my_cpu_ctl_env);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"task cancelled");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void init(const Vector& in) 
    {
      /* copy data to internal vector */
      vec.resize(in.size());
      parallel_for( size_t(0), in.size(), size_t(4*4096), [&](const range<size_t>& r) {
	for (size_t i=r.begin(); i<r.end(); i++) 
	  vec[i] = in[i];
      });

      /* sort the data */
      std::vector<T> temp(in.size());
      radix_sort<T>(vec.data(),temp.data(),vec.size());
    }